

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall kj::anon_unknown_36::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  StringPtr reason;
  char *in_RCX;
  uint16_t in_DX;
  undefined4 in_register_00000034;
  size_t in_R8;
  ArrayPtr<const_unsigned_char> AVar1;
  undefined1 local_60 [8];
  Promise<void> promise;
  Array<unsigned_char> payload;
  uint16_t code_local;
  WebSocketImpl *this_local;
  StringPtr reason_local;
  
  reason.content.size_ = in_R8;
  reason.content.ptr = in_RCX;
  serializeClose((Array<unsigned_char> *)&stack0xffffffffffffffb8,
                 (WebSocketImpl *)CONCAT44(in_register_00000034,__fd),in_DX,reason);
  AVar1 = kj::Array::operator_cast_to_ArrayPtr((Array *)&stack0xffffffffffffffb8);
  AVar1.size_ = (size_t)AVar1.ptr;
  AVar1.ptr = (uchar *)0x8;
  sendImpl((WebSocketImpl *)local_60,(byte)__fd,AVar1);
  mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&stack0xffffffffffffffb8);
  Promise<void>::attach<kj::Array<unsigned_char>>
            ((Promise<void> *)this,(Array<unsigned_char> *)local_60);
  Promise<void>::~Promise((Promise<void> *)local_60);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&stack0xffffffffffffffb8);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload = serializeClose(code, reason);
    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }